

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O1

void __thiscall
TPZCompElH1<pzshape::TPZShapeCube>::Shape
          (TPZCompElH1<pzshape::TPZShapeCube> *this,TPZVec<double> *pt,TPZFMatrix<double> *phi,
          TPZFMatrix<double> *dphi)

{
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar1;
  long lVar2;
  long lVar3;
  TPZVec<long> local_100;
  long alStack_e0 [8];
  TPZVec<int> local_a0;
  int aiStack_80 [20];
  
  TPZVec<long>::TPZVec(&local_100,0);
  local_100._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840b58;
  local_100.fStore = alStack_e0;
  local_100.fNElements = 8;
  local_100.fNAlloc = 0;
  alStack_e0[0] = 0;
  alStack_e0[1] = 0;
  alStack_e0[2] = 0;
  alStack_e0[3] = 0;
  alStack_e0[4] = 0;
  alStack_e0[5] = 0;
  alStack_e0[6] = 0;
  alStack_e0[7] = 0;
  TPZVec<int>::TPZVec(&local_a0,0);
  local_a0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840040;
  local_a0.fNElements = 0x13;
  local_a0.fNAlloc = 0;
  aiStack_80[0] = 0;
  aiStack_80[1] = 0;
  aiStack_80[2] = 0;
  aiStack_80[3] = 0;
  aiStack_80[4] = 0;
  aiStack_80[5] = 0;
  aiStack_80[6] = 0;
  aiStack_80[7] = 0;
  aiStack_80[8] = 0;
  aiStack_80[9] = 0;
  aiStack_80[10] = 0;
  aiStack_80[0xb] = 0;
  aiStack_80[0xc] = 0;
  aiStack_80[0xd] = 0;
  aiStack_80[0xe] = 0;
  aiStack_80[0xf] = 0;
  aiStack_80[0x10] = 0;
  aiStack_80[0x11] = 0;
  aiStack_80[0x12] = 0;
  local_a0.fStore = aiStack_80;
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  lVar3 = 0;
  do {
    pTVar1 = TPZGeoEl::NodePtr(this_00,(int)lVar3);
    local_100.fStore[lVar3] = (long)pTVar1->fId;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  lVar3 = 0;
  do {
    lVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeCube>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,(int)lVar3 + 8);
    local_a0.fStore[lVar3] = (uint)*(byte *)(lVar2 + 0x14);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x13);
  pzshape::TPZShapeCube::Shape(pt,&local_100,&local_a0,phi,dphi);
  if (local_a0.fStore == aiStack_80) {
    local_a0.fStore = (int *)0x0;
  }
  local_a0.fNAlloc = 0;
  local_a0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_a0.fStore != (int *)0x0) {
    operator_delete__(local_a0.fStore);
  }
  if (local_100.fStore == alStack_e0) {
    local_100.fStore = (long *)0x0;
  }
  local_100.fNAlloc = 0;
  local_100._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_100.fStore != (long *)0x0) {
    operator_delete__(local_100.fStore);
  }
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
	TPZManVector<int64_t,TSHAPE::NCornerNodes> id(TSHAPE::NCornerNodes,0);
	TPZManVector<int, TSHAPE::NSides-TSHAPE::NCornerNodes+1> ord(TSHAPE::NSides-TSHAPE::NCornerNodes,0);
	int i;
	TPZGeoEl *ref = this->Reference();
	for(i=0; i<TSHAPE::NCornerNodes; i++) {
		id[i] = ref->NodePtr(i)->Id();
	}
	for(i=0; i<TSHAPE::NSides-TSHAPE::NCornerNodes; i++) {
		ord[i] = this->Connect(i+TSHAPE::NCornerNodes).Order();
	}
	TSHAPE::Shape(pt,id,ord,phi,dphi);
}